

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayOrListLengthBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  int iVar2;
  reference pvVar3;
  pointer pEVar4;
  reference this_00;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  code *__f;
  allocator local_41;
  string local_40;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])(pEVar4);
  if ((char)iVar2 == '\0') {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    if ((pEVar4->return_type).id_ != UNKNOWN) {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      LVar1 = (pEVar4->return_type).id_;
      if (LVar1 == ARRAY) {
        __f = ArrayLengthFunction;
      }
      else {
        if (LVar1 != LIST) {
          this_02 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_40,"length can only be used on arrays or lists",&local_41);
          BinderException::BinderException(this_02,&local_40);
          __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        __f = ListLengthFunction;
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 &bound_function->function,__f);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      this_00 = vector<duckdb::LogicalType,_true>::get<true>
                          (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                            arguments,0);
      LogicalType::operator=(this_00,&pEVar4->return_type);
      *(undefined8 *)this = 0;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_01);
  __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> ArrayOrListLengthBind(ClientContext &context, ScalarFunction &bound_function,
                                                      vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}

	const auto &arg_type = arguments[0]->return_type.id();
	if (arg_type == LogicalTypeId::ARRAY) {
		bound_function.function = ArrayLengthFunction;
	} else if (arg_type == LogicalTypeId::LIST) {
		bound_function.function = ListLengthFunction;
	} else {
		// Unreachable
		throw BinderException("length can only be used on arrays or lists");
	}
	bound_function.arguments[0] = arguments[0]->return_type;
	return nullptr;
}